

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O2

void (anonymous_namespace)::visit<Imath_2_5::Vec2<short>>
               (int *level,int n,int k,vector<int,_std::allocator<int>_> *value,
               vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_> *perms)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  Vec2<short> p;
  value_type local_3c;
  long local_38;
  
  iVar1 = *level;
  *level = iVar1 + 1;
  local_38 = (long)k;
  piVar2 = (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2[local_38] = iVar1 + 1;
  if (*level == n) {
    piVar3 = (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish;
    for (uVar4 = 0; (ulong)uVar4 < (ulong)((long)piVar3 - (long)piVar2 >> 2); uVar4 = uVar4 + 1) {
      (&local_3c.x)[(int)uVar4] = (short)piVar2[uVar4];
    }
    std::vector<Imath_2_5::Vec2<short>,_std::allocator<Imath_2_5::Vec2<short>_>_>::push_back
              (perms,&local_3c);
  }
  else {
    uVar5 = 0;
    uVar6 = 0;
    if (0 < n) {
      uVar6 = (ulong)(uint)n;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      if ((value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[uVar5] == 0) {
        visit<Imath_2_5::Vec2<short>>(level,n,(int)uVar5,value,perms);
      }
    }
  }
  *level = *level + -1;
  (value->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [local_38] = 0;
  return;
}

Assistant:

static void
visit(int &level, int n, int k, std::vector<int> &value, std::vector<T> &perms)
{
    level = level + 1;
    value[k] = level;

    if (level == n)
        addItem(value, perms);
    else
        for (int i = 0; i < n; i++)
            if (value[i] == 0)
                visit(level, n, i, value, perms);

    level = level - 1;
    value[k] = 0;
}